

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::check_done
          (basic_json_parser<char,_std::allocator<char>_> *this,error_code *ec)

{
  bool bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)this->input_ptr_;
  do {
    if (pbVar2 == (byte *)this->end_input_) {
      return;
    }
    if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) {
      bVar1 = std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
                        (&this->err_handler_,extra_character,&this->super_ser_context);
      this->more_ = bVar1;
      if (!bVar1) {
        std::error_code::operator=(ec,extra_character);
        return;
      }
      pbVar2 = (byte *)this->input_ptr_;
    }
    pbVar2 = pbVar2 + 1;
    this->input_ptr_ = (char_type *)pbVar2;
  } while( true );
}

Assistant:

void check_done(std::error_code& ec)
    {
        for (; input_ptr_ != end_input_; ++input_ptr_)
        {
            char_type curr_char_ = *input_ptr_;
            switch (curr_char_)
            {
                case '\n':
                case '\r':
                case '\t':
                case ' ':
                    break;
                default:
                    more_ = err_handler_(json_errc::extra_character, *this);
                    if (!more_)
                    {
                        ec = json_errc::extra_character;
                        return;
                    }
                    break;
            }
        }
    }